

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O3

string * __thiscall
antlr::NoViableAltException::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltException *this)

{
  size_type *psVar1;
  TokenRef *pTVar2;
  Token *pTVar3;
  ASTRef *pAVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  pTVar2 = (this->token).ref;
  if ((pTVar2 == (TokenRef *)0x0) || (pTVar3 = pTVar2->ptr, pTVar3 == (Token *)0x0)) {
    pAVar4 = (this->node).ref;
    if ((pAVar4 != (ASTRef *)0x0) && (pAVar4->ptr != (AST *)0x0)) {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"unexpected AST node: ","");
      (*((this->node).ref)->ptr->_vptr_AST[0x18])(&local_58);
      uVar10 = 0xf;
      if (local_38 != local_28) {
        uVar10 = local_28[0];
      }
      if (uVar10 < (ulong)(local_50 + local_30)) {
        uVar10 = 0xf;
        if (local_58 != local_48) {
          uVar10 = local_48[0];
        }
        if ((ulong)(local_50 + local_30) <= uVar10) {
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
          goto LAB_001862f7;
        }
      }
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_001862f7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar1 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar1) {
        uVar5 = puVar7[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      }
      __return_storage_ptr__->_M_string_length = puVar7[1];
      *puVar7 = psVar1;
      puVar7[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      if (local_38 == local_28) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38,local_28[0] + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "unexpected end of subtree";
    pcVar8 = "";
  }
  else {
    iVar6 = (*pTVar3->_vptr_Token[6])();
    if (iVar6 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "unexpected end of file";
      pcVar8 = "";
    }
    else {
      iVar6 = (*((this->token).ref)->ptr->_vptr_Token[6])();
      if (iVar6 != 3) {
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unexpected token: ","")
        ;
        (*((this->token).ref)->ptr->_vptr_Token[4])(&local_58);
        uVar10 = 0xf;
        if (local_38 != local_28) {
          uVar10 = local_28[0];
        }
        if (uVar10 < (ulong)(local_50 + local_30)) {
          uVar10 = 0xf;
          if (local_58 != local_48) {
            uVar10 = local_48[0];
          }
          if ((ulong)(local_50 + local_30) <= uVar10) {
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
            goto LAB_001862f7;
          }
        }
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
        goto LAB_001862f7;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "unexpected end of tree";
      pcVar8 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

string NoViableAltException::getMessage() const
{
	if (token)
	{
		if( token->getType() == Token::EOF_TYPE )
			return string("unexpected end of file");
		else if( token->getType() == Token::NULL_TREE_LOOKAHEAD )
			return string("unexpected end of tree");
		else
			return string("unexpected token: ")+token->getText();
	}

	// must a tree parser error if token==null
	if (!node)
		return "unexpected end of subtree";

	return string("unexpected AST node: ")+node->toString();
}